

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.hpp
# Opt level: O1

void __thiscall InstructionSet::x86::Flags::set(Flags *this,uint16_t value)

{
  uint uVar1;
  
  uVar1 = (uint)value;
  this->carry_ = uVar1 & 1;
  this->auxiliary_carry_ = uVar1 & 0x10;
  this->overflow_ = uVar1 & 0x800;
  this->trap_ = uVar1 & 0x100;
  this->interrupt_ = uVar1 & 0x200;
  this->direction_ = -(uint)((value >> 10 & 1) != 0) | 1;
  this->sign_ = uVar1 & 0x80;
  this->zero_ = ~uVar1 & 0x40;
  this->parity_ = ~uVar1 & 4;
  return;
}

Assistant:

void set(uint16_t value) {
			set_from<Flag::Carry>(value & FlagValue::Carry);
			set_from<Flag::AuxiliaryCarry>(value & FlagValue::AuxiliaryCarry);
			set_from<Flag::Overflow>(value & FlagValue::Overflow);
			set_from<Flag::Trap>(value & FlagValue::Trap);
			set_from<Flag::Interrupt>(value & FlagValue::Interrupt);
			set_from<Flag::Direction>(value & FlagValue::Direction);

			set_from<uint8_t, Flag::Sign>(uint8_t(value));

			set_from<Flag::Zero>((~value) & FlagValue::Zero);
			set_from<Flag::ParityOdd>((~value) & FlagValue::Parity);
		}